

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDocument.cpp
# Opt level: O3

bool __thiscall iDynTree::URDFDocument::documentHasBeenParsed(URDFDocument *this)

{
  Model *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>_>
  *materialDatabase;
  ostream *poVar1;
  _Hash_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  element_type *peVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long *plVar12;
  ulong uVar13;
  iterator iVar14;
  ostream *poVar15;
  SensorsList *pSVar16;
  undefined4 extraout_var;
  Sensor *pSVar17;
  ModelSolidShapes *pMVar18;
  _Hash_node_base *p_Var19;
  pointer psVar20;
  long lVar21;
  uint uVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rootCandidates;
  string baseLinkName;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  childLinks;
  Model newModel;
  Model normalizedModel;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  SensorsList local_358 [16];
  _Hash_node_base *local_348;
  long *local_340 [2];
  long local_330 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_320;
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [7];
  ios_base local_268 [264];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_160 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_150 [5];
  
  this_00 = &this->m_model;
  p_Var19 = (this->m_buffers).joints._M_h._M_before_begin._M_nxt;
  local_320._M_buckets = &local_320._M_single_bucket;
  local_320._M_bucket_count = 1;
  local_320._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_320._M_element_count = 0;
  local_320._M_rehash_policy._M_max_load_factor = 1.0;
  local_320._M_rehash_policy._M_next_resize = 0;
  local_320._M_single_bucket = (__node_base_ptr)0x0;
  for (; p_Var19 != (_Hash_node_base *)0x0; p_Var19 = p_Var19->_M_nxt) {
    local_2e8._0_8_ = &((key_type *)local_2e8)->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e8,p_Var19[1]._M_nxt,
               (long)&(p_Var19[2]._M_nxt)->_M_nxt + (long)p_Var19[1]._M_nxt);
    p_Var2 = p_Var19[5]._M_nxt;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[6]._M_nxt;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    uVar10 = iDynTree::Model::getLinkIndex((string *)this_00);
    local_348 = p_Var19 + 0x11;
    uVar11 = iDynTree::Model::getLinkIndex((string *)this_00);
    (*(code *)p_Var2->_M_nxt[5]._M_nxt)(p_Var2,uVar10,uVar11);
    plVar12 = (long *)__dynamic_cast(p_Var2,&IJoint::typeinfo,&RevoluteJoint::typeinfo,0);
    if (plVar12 == (long *)0x0) {
      plVar12 = (long *)__dynamic_cast(p_Var2,&IJoint::typeinfo,&PrismaticJoint::typeinfo,0);
      if (plVar12 != (long *)0x0) {
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        (**(code **)(*plVar12 + 0x128))(plVar12,p_Var19 + 7,uVar11,uVar10);
        goto LAB_001298dd;
      }
      iDynTree::reportError("URDFDocument","processJoints","Unrecognized joint type");
    }
    else {
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      (**(code **)(*plVar12 + 0x128))(plVar12,p_Var19 + 7,uVar11,uVar10);
LAB_001298dd:
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
    }
    iDynTree::Model::addJoint((string *)this_00,(IJoint *)local_2e8);
    local_160[0] = &local_320;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_160[0],local_348,local_160);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &((key_type *)local_2e8)->field_2) {
      operator_delete((void *)local_2e8._0_8_,local_2d8[0]._M_allocated_capacity + 1);
    }
  }
  p_Var19 = (this->m_buffers).fixedJoints._M_h._M_before_begin._M_nxt;
  if (p_Var19 != (_Hash_node_base *)0x0) {
    do {
      local_2e8._0_8_ = &((key_type *)local_2e8)->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,p_Var19[1]._M_nxt,
                 (long)&(p_Var19[2]._M_nxt)->_M_nxt + (long)p_Var19[1]._M_nxt);
      p_Var2 = p_Var19[5]._M_nxt;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[6]._M_nxt;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      uVar10 = iDynTree::Model::getLinkIndex((string *)this_00);
      uVar11 = iDynTree::Model::getLinkIndex((string *)this_00);
      (*(code *)p_Var2->_M_nxt[5]._M_nxt)(p_Var2,uVar10,uVar11);
      iDynTree::Model::addJoint((string *)this_00,(IJoint *)local_2e8);
      local_160[0] = &local_320;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_160[0],p_Var19 + 0x11,local_160);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._0_8_ != &((key_type *)local_2e8)->field_2) {
        operator_delete((void *)local_2e8._0_8_,local_2d8[0]._M_allocated_capacity + 1);
      }
      p_Var19 = p_Var19->_M_nxt;
    } while (p_Var19 != (_Hash_node_base *)0x0);
  }
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar22 = 0; uVar13 = iDynTree::Model::getNrOfLinks(), uVar22 < uVar13; uVar22 = uVar22 + 1) {
    iDynTree::Model::getLinkName_abi_cxx11_((long)local_2e8);
    iVar14 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(&local_320,(key_type *)local_2e8);
    if (iVar14.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_378,(key_type *)local_2e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &((key_type *)local_2e8)->field_2) {
      operator_delete((void *)local_2e8._0_8_,local_2d8[0]._M_allocated_capacity + 1);
    }
  }
  if (local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iDynTree::reportError("RobotElement","exitElementScope","No root link found in URDF string");
    iDynTree::Model::Model((Model *)local_2e8);
    iDynTree::Model::operator=(this_00,(Model *)local_2e8);
    iDynTree::Model::~Model((Model *)local_2e8);
  }
  else {
    if ((ulong)((long)local_378.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_378.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      iDynTree::Model::getLinkIndex((string *)this_00);
      iDynTree::Model::setDefaultBaseLink((long)this_00);
      iDynTree::Model::Model((Model *)local_2e8);
      iDynTree::Model::Model((Model *)local_160);
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      iDynTree::Model::setPackageDirs((vector *)local_2e8);
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      iDynTree::Model::setPackageDirs((vector *)local_160);
      cVar6 = iDynTree::removeFakeLinks(this_00,(Model *)local_2e8);
      if (cVar6 == '\0') {
        iDynTree::reportError
                  ("URDFDocument","documentHasBeenParsed",
                   "Failed to remove fake links from the model");
        bVar7 = false;
      }
      else {
        iDynTree::Model::getDefaultBaseLink();
        iDynTree::Model::getLinkName_abi_cxx11_((long)local_340);
        cVar6 = iDynTree::createModelWithNormalizedJointNumbering
                          ((Model *)local_2e8,(string *)local_340,(Model *)local_160);
        if (cVar6 == '\0') {
          iDynTree::reportError
                    ("URDFDocument","documentHasBeenParsed",
                     "Failed to remove fake links from the model");
LAB_00129f3b:
          bVar7 = false;
        }
        else {
          iDynTree::Model::operator=(this_00,(Model *)local_160);
          iDynTree::SensorsList::SensorsList(local_358);
          pSVar16 = (SensorsList *)iDynTree::Model::sensors();
          iDynTree::SensorsList::operator=(pSVar16,local_358);
          iDynTree::SensorsList::~SensorsList(local_358);
          psVar4 = (this->m_buffers).sensorHelpers.
                   super__Vector_base<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar20 = (this->m_buffers).sensorHelpers.
                         super__Vector_base<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar20 != psVar4;
              psVar20 = psVar20 + 1) {
            peVar5 = (psVar20->
                     super___shared_ptr<iDynTree::SensorHelper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            iVar9 = (*peVar5->_vptr_SensorHelper[2])(peVar5,this_00);
            plVar12 = (long *)CONCAT44(extraout_var,iVar9);
            if (plVar12 == (long *)0x0) {
              iDynTree::SensorsList::SensorsList(local_358);
              pSVar16 = (SensorsList *)iDynTree::Model::sensors();
              iDynTree::SensorsList::operator=(pSVar16,local_358);
              iDynTree::SensorsList::~SensorsList(local_358);
              goto LAB_00129f3b;
            }
            pSVar17 = (Sensor *)iDynTree::Model::sensors();
            iDynTree::SensorsList::addSensor(pSVar17);
            (**(code **)(*plVar12 + 8))(plVar12);
          }
          if (((this->m_options).addSensorFramesAsAdditionalFrames == true) &&
             (bVar7 = addSensorFramesAsAdditionalFramesToModel(this_00), !bVar7)) goto LAB_00129f3b;
          pMVar18 = (ModelSolidShapes *)iDynTree::Model::visualSolidShapes();
          materialDatabase = &(this->m_buffers).materials;
          bVar7 = addVisualPropertiesToModel
                            (this_00,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>_>_>_>
                                      *)(this->m_buffers).visuals._M_h._M_before_begin._M_nxt,
                             materialDatabase,pMVar18);
          if (!bVar7) {
            iDynTree::reportError
                      ("URDFDocument","documentHasBeenParsed",
                       "Failed to add visual elements to model");
          }
          pMVar18 = (ModelSolidShapes *)iDynTree::Model::collisionSolidShapes();
          bVar8 = addVisualPropertiesToModel
                            (this_00,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>_>_>_>
                                      *)(this->m_buffers).collisions._M_h._M_before_begin._M_nxt,
                             materialDatabase,pMVar18);
          bVar7 = true;
          if (!bVar8) {
            iDynTree::reportError
                      ("URDFDocument","documentHasBeenParsed",
                       "Failed to add collision elements to model");
          }
        }
        if (local_340[0] != local_330) {
          operator_delete(local_340[0],local_330[0] + 1);
        }
      }
      iDynTree::Model::~Model((Model *)local_160);
      iDynTree::Model::~Model((Model *)local_2e8);
      goto LAB_00129f72;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_2e8);
    poVar1 = (ostream *)&((key_type *)local_2e8)->field_2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Multiple (",10);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") root links: (",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,((local_378.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
               (local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    if (0x20 < (ulong)((long)local_378.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_378.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      uVar13 = 1;
      lVar21 = 0x28;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,*(char **)((long)local_378.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                   *(long *)((long)&((local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar21));
        uVar13 = uVar13 + 1;
        lVar21 = lVar21 + 0x20;
      } while (uVar13 < (ulong)((long)local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") found in URDF string",0x16);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("RobotElement","exitElementScope",(char *)local_160[0]);
    if (local_160[0] != local_150) {
      operator_delete(local_160[0],(long)local_150[0]._M_buckets + 1);
    }
    iDynTree::Model::Model((Model *)local_160);
    iDynTree::Model::operator=(this_00,(Model *)local_160);
    iDynTree::Model::~Model((Model *)local_160);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2e8);
    std::ios_base::~ios_base(local_268);
  }
  bVar7 = false;
LAB_00129f72:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_378);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_320);
  return bVar7;
}

Assistant:

bool URDFDocument::documentHasBeenParsed()
    {
        // Maybe it is not the cleanest solution to process the model here,
        // but the after the scope is exited, the Model should be fully formed.
        // Add the joints to the model
        std::unordered_set<std::string> childLinks = processJoints(m_model,
                                                                   m_buffers.joints,
                                                                   m_buffers.fixedJoints);
        // Get root
        std::vector<std::string> rootCandidates;
        for(unsigned link = 0; link < m_model.getNrOfLinks(); ++link)
        {
            std::string linkName = m_model.getLinkName(link);
            if (childLinks.find(linkName) == childLinks.end() )
            {
                rootCandidates.push_back(linkName);
            }
        }

        if (rootCandidates.empty()) {
            reportError("RobotElement", "exitElementScope", "No root link found in URDF string");
            m_model = Model();
            return false;
        }

        if (rootCandidates.size() >= 2) {
            std::stringstream ss;
            ss << "Multiple (" << rootCandidates.size() << ") root links: (";
            ss << rootCandidates[0];
            for (size_t root = 1; root < rootCandidates.size(); ++root)
            {
                ss << ", " << rootCandidates[root];
            }
            ss << ") found in URDF string";

            reportError("RobotElement", "exitElementScope", ss.str().c_str());
            m_model = Model();
            return false;
        }

        // set the default root in the model
        m_model.setDefaultBaseLink(m_model.getLinkIndex(rootCandidates[0]));
        iDynTree::Model newModel, normalizedModel;
        newModel.setPackageDirs(m_model.getPackageDirs());
        normalizedModel.setPackageDirs(m_model.getPackageDirs());

        if (!removeFakeLinks(m_model, newModel)) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to remove fake links from the model");
            return false;
        }

        std::string baseLinkName = newModel.getLinkName(newModel.getDefaultBaseLink());
        if (!createModelWithNormalizedJointNumbering(newModel, baseLinkName, normalizedModel)) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to remove fake links from the model");
            return false;
        }

        m_model = normalizedModel;

        if (!processSensors(m_model, m_buffers.sensorHelpers))
        {
            //TODO: error
            return false;
        }

        if (m_options.addSensorFramesAsAdditionalFrames)
        {
            if (!addSensorFramesAsAdditionalFramesToModel(m_model)) {
                //TODO: error
                return false;
            }
        }

        // Assign visual properties to objects
        if (!addVisualPropertiesToModel(m_model,
                                        m_buffers.visuals,
                                        m_buffers.materials,
                                        m_model.visualSolidShapes())) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to add visual elements to model");
        }
        if (!addVisualPropertiesToModel(m_model,
                                        m_buffers.collisions,
                                        m_buffers.materials,
                                        m_model.collisionSolidShapes())) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to add collision elements to model");
        }

        return true;
    }